

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  XMLError error;
  ostream *poVar3;
  long lVar4;
  string *this;
  string filename;
  string api;
  VulkanHppGenerator generator;
  XMLDocument doc;
  
  if ((argc & 1U) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "VulkanHppGenerator usage: VulkanHppGenerator [-f filename][-api [vulkan|vulkansc]]"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"\tdefault for filename is <");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/Vulkan-Headers/registry/vk.xml"
                            );
    poVar3 = std::operator<<(poVar3,">");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"\tdefault for api <vulkan>");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "\tsupported values for api are <vulkan> and <vulkansc>");
    std::endl<char,std::char_traits<char>>(poVar3);
    return -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&api,"vulkan",(allocator<char> *)&generator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,
             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/Vulkan-Headers/registry/vk.xml"
             ,(allocator<char> *)&generator);
  lVar4 = 1;
  do {
    if (argc <= lVar4) {
      bVar1 = std::operator==(&api,"vulkan");
      if ((bVar1) || (bVar1 = std::operator==(&api,"vulkansc"), bVar1)) {
        std::operator<<((ostream *)&std::cout,
                        "VulkanHppGenerator: could not find clang-format. The generated files will not be formatted accordingly.\n"
                       );
        tinyxml2::XMLDocument::XMLDocument(&doc,true,PRESERVE_WHITESPACE);
        poVar3 = std::operator<<((ostream *)&std::cout,"VulkanHppGenerator: Loading ");
        poVar3 = std::operator<<(poVar3,(string *)&filename);
        std::endl<char,std::char_traits<char>>(poVar3);
        error = tinyxml2::XMLDocument::LoadFile(&doc,filename._M_dataplus._M_p);
        if (error == XML_SUCCESS) {
          poVar3 = std::operator<<((ostream *)&std::cout,"VulkanHppGenerator: Parsing ");
          poVar3 = std::operator<<(poVar3,(string *)&filename);
          std::endl<char,std::char_traits<char>>(poVar3);
          VulkanHppGenerator::VulkanHppGenerator(&generator,&doc,&api);
          VulkanHppGenerator::prepareRAIIHandles(&generator);
          VulkanHppGenerator::generateCppModuleFile(&generator);
          VulkanHppGenerator::generateHppFile(&generator);
          VulkanHppGenerator::generateEnumsHppFile(&generator);
          VulkanHppGenerator::generateExtensionInspectionFile(&generator);
          VulkanHppGenerator::generateFormatTraitsHppFile(&generator);
          VulkanHppGenerator::generateFuncsHppFile(&generator);
          VulkanHppGenerator::generateHandlesHppFile(&generator);
          VulkanHppGenerator::generateHashHppFile(&generator);
          VulkanHppGenerator::generateMacrosFile(&generator);
          VulkanHppGenerator::generateSharedHppFile(&generator);
          VulkanHppGenerator::generateStaticAssertionsHppFile(&generator);
          VulkanHppGenerator::generateStructsHppFile(&generator);
          VulkanHppGenerator::generateToStringHppFile(&generator);
          VulkanHppGenerator::distributeSecondLevelCommands(&generator);
          VulkanHppGenerator::generateRAIIHppFile(&generator);
          VulkanHppGenerator::~VulkanHppGenerator(&generator);
          iVar2 = 0;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,"VulkanHppGenerator: failed to load file ")
          ;
          poVar3 = std::operator<<(poVar3,(string *)&filename);
          poVar3 = std::operator<<(poVar3," with error <");
          toString_abi_cxx11_(&generator.m_api,error);
          poVar3 = std::operator<<(poVar3,(string *)&generator);
          poVar3 = std::operator<<(poVar3,">");
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&generator);
          iVar2 = -1;
        }
        tinyxml2::XMLDocument::~XMLDocument(&doc);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"unsupported api <");
        poVar3 = std::operator<<(poVar3,(string *)&api);
        poVar3 = std::operator<<(poVar3,">");
        std::endl<char,std::char_traits<char>>(poVar3);
LAB_0018ea89:
        iVar2 = -1;
      }
      std::__cxx11::string::~string((string *)&filename);
      std::__cxx11::string::~string((string *)&api);
      return iVar2;
    }
    __s1 = argv[lVar4];
    iVar2 = strcmp(__s1,"-api");
    this = &api;
    if ((iVar2 != 0) &&
       (((*__s1 != '-' || (__s1[1] != 'f')) || (this = &filename, __s1[2] != '\0')))) {
      poVar3 = std::operator<<((ostream *)&std::cout,"unsupported argument <");
      poVar3 = std::operator<<(poVar3,argv[lVar4]);
      poVar3 = std::operator<<(poVar3,">");
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_0018ea89;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (this,argv[lVar4 + 1]);
    lVar4 = lVar4 + 2;
  } while( true );
}

Assistant:

int main( int argc, char const ** argv )
{
  if ( ( argc % 2 ) == 0 )
  {
    std::cout << "VulkanHppGenerator usage: VulkanHppGenerator [-f filename][-api [vulkan|vulkansc]]" << std::endl;
    std::cout << "\tdefault for filename is <" << VK_SPEC << ">" << std::endl;
    std::cout << "\tdefault for api <vulkan>" << std::endl;
    std::cout << "\tsupported values for api are <vulkan> and <vulkansc>" << std::endl;
    return -1;
  }

  std::string api      = "vulkan";
  std::string filename = VK_SPEC;
  for ( int i = 1; i < argc; i += 2 )
  {
    if ( strcmp( argv[i], "-api" ) == 0 )
    {
      api = argv[i + 1];
    }
    else if ( strcmp( argv[i], "-f" ) == 0 )
    {
      filename = argv[i + 1];
    }
    else
    {
      std::cout << "unsupported argument <" << argv[i] << ">" << std::endl;
      return -1;
    }
  }

  if ( ( api != "vulkan" ) && ( api != "vulkansc" ) )
  {
    std::cout << "unsupported api <" << api << ">" << std::endl;
    return -1;
  }

#if defined( CLANG_FORMAT_EXECUTABLE )
  std::cout << "VulkanHppGenerator: Found ";
  std::string commandString = "\"" CLANG_FORMAT_EXECUTABLE "\" --version ";
  const int   ret           = std::system( commandString.c_str() );
  if ( ret != 0 )
  {
    std::cout << "VulkanHppGenerator: failed to determine clang_format version with error <" << ret << ">\n";
  }
#else
  std::cout << "VulkanHppGenerator: could not find clang-format. The generated files will not be formatted accordingly.\n";
#endif

  tinyxml2::XMLDocument doc;
  std::cout << "VulkanHppGenerator: Loading " << filename << std::endl;
  const tinyxml2::XMLError error = doc.LoadFile( filename.c_str() );
  if ( error != tinyxml2::XML_SUCCESS )
  {
    std::cout << "VulkanHppGenerator: failed to load file " << filename << " with error <" << toString( error ) << ">" << std::endl;
    return -1;
  }

  try
  {
    std::cout << "VulkanHppGenerator: Parsing " << filename << std::endl;
    VulkanHppGenerator generator( doc, api );

    generator.prepareRAIIHandles();
    generator.generateCppModuleFile();
    generator.generateHppFile();
    generator.generateEnumsHppFile();
    generator.generateExtensionInspectionFile();
    generator.generateFormatTraitsHppFile();
    generator.generateFuncsHppFile();
    generator.generateHandlesHppFile();
    generator.generateHashHppFile();
    generator.generateMacrosFile();
    generator.generateSharedHppFile();
    generator.generateStaticAssertionsHppFile();
    generator.generateStructsHppFile();
    generator.generateToStringHppFile();

    // this modifies the generator data and needs to be done after all the other generations are done
    generator.distributeSecondLevelCommands();
    generator.generateRAIIHppFile();
  }
  catch ( std::exception const & e )
  {
    std::cout << "caught exception: " << e.what() << std::endl;
    return -1;
  }
  catch ( ... )
  {
    std::cout << "caught unknown exception" << std::endl;
    return -1;
  }
}